

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O2

wchar_t tval_find_idx(char *name)

{
  ulong uVar1;
  long lVar2;
  _Bool _Var3;
  wchar_t wVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  char *pe;
  char local_48 [48];
  
  uVar5 = strtoul(name,&pe,10);
  if (pe == name) {
    my_strcpy(local_48,name,0x28);
    pcVar6 = strstr(local_48,"armour");
    if (pcVar6 != (char *)0x0) {
      my_strcpy(pcVar6 + 4,"r",2);
    }
    pcVar6 = string_make(local_48);
    lVar2 = -0x10;
    do {
      lVar7 = lVar2;
      if (lVar7 + 0x10 == 0x240) {
        string_free(pcVar6);
        return L'\xffffffff';
      }
      wVar4 = my_stricmp(pcVar6,*(char **)((long)&tval_names[1].name + lVar7));
      lVar2 = lVar7 + 0x10;
    } while (wVar4 != L'\0');
    string_free(pcVar6);
    wVar4 = *(wchar_t *)((long)&tval_names[1].tval + lVar7);
  }
  else {
    _Var3 = contains_only_spaces(pe);
    uVar1 = 0xffffffffffffffff;
    if (uVar5 < 0x24) {
      uVar1 = uVar5;
    }
    wVar4 = (wchar_t)uVar1;
    if (!_Var3) {
      wVar4 = L'\xffffffff';
    }
  }
  return wVar4;
}

Assistant:

int tval_find_idx(const char *name)
{
	size_t i;
	char *mod_name, *pe;
	unsigned long r = strtoul(name, &pe, 10);

	if (pe != name) {
		return (contains_only_spaces(pe) && r < TV_MAX) ? (int)r : -1;
	}

	mod_name = de_armour(name);

	for (i = 0; i < N_ELEMENTS(tval_names); i++) {
		if (!my_stricmp(mod_name, tval_names[i].name)) {
			string_free(mod_name);
			return tval_names[i].tval;
		}
	}

	string_free(mod_name);
	return -1;
}